

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_verify(secp256k1_gej *a)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  uint64_t uVar174;
  uint64_t uVar175;
  uint64_t uVar176;
  int iVar177;
  uint uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  secp256k1_gej *b;
  secp256k1_gej *in_RSI;
  secp256k1_ge *psVar183;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar184;
  secp256k1_gej *psVar185;
  secp256k1_gej *a_01;
  secp256k1_gej *a_02;
  secp256k1_ge *psVar186;
  secp256k1_ge *r;
  secp256k1_ge *a_03;
  ulong uVar187;
  ulong uVar188;
  ulong uVar189;
  secp256k1_gej *a_04;
  undefined8 unaff_R15;
  undefined1 auVar190 [16];
  undefined1 auStack_1b0 [56];
  uint64_t uStack_178;
  uint64_t uStack_170;
  uint64_t uStack_168;
  uint64_t uStack_160;
  undefined8 uStack_158;
  int iStack_154;
  secp256k1_gej *psStack_150;
  secp256k1_ge *psStack_148;
  code *pcStack_140;
  secp256k1_gej *psStack_130;
  secp256k1_gej *psStack_128;
  secp256k1_gej *psStack_120;
  secp256k1_gej *psStack_110;
  secp256k1_gej *psStack_108;
  secp256k1_ge *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_ge *psStack_e8;
  undefined1 auStack_e0 [72];
  uint64_t uStack_98;
  uint64_t uStack_90;
  long lStack_88;
  uint64_t uStack_80;
  ulong uStack_78;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  int iStack_40;
  secp256k1_gej *psStack_38;
  
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  psVar185 = (secp256k1_gej *)&a->z;
  secp256k1_fe_verify((secp256k1_fe *)psVar185);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_gej_verify_cold_1();
  psStack_108 = (secp256k1_gej *)0x119eb4;
  psStack_38 = a;
  secp256k1_gej_verify(in_RSI);
  psVar185->infinity = in_RSI->infinity;
  psVar183 = (secp256k1_ge *)&in_RSI->z;
  b = (secp256k1_gej *)&in_RSI->y;
  psStack_108 = (secp256k1_gej *)0x119ed5;
  secp256k1_fe_mul(&psVar185->z,(secp256k1_fe *)psVar183,(secp256k1_fe *)b);
  psStack_108 = (secp256k1_gej *)0x119edd;
  a_01 = b;
  secp256k1_fe_verify((secp256k1_fe *)b);
  if ((in_RSI->y).magnitude < 9) {
    uVar182 = ((secp256k1_fe *)b)->n[0];
    uVar187 = (in_RSI->y).n[1];
    uVar188 = (in_RSI->y).n[2];
    uVar189 = (in_RSI->y).n[3];
    uVar181 = (in_RSI->y).n[4];
    unaff_R15 = 0xfffffffffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar182 * 2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar189;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar187 * 2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar188;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar181;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar181;
    uVar179 = SUB168(auVar4 * auVar84,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar179 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
    uVar180 = auVar2._0_8_;
    uStack_68 = uVar180 & 0xfffffffffffff;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    a_04 = (secp256k1_gej *)(uVar181 * 2);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar182;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = a_04;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar187 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar189;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar188;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar188;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar179 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
    auVar2 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar181 = auVar2._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    psStack_f8 = (secp256k1_ge *)((uVar181 & 0xfffffffffffff) >> 0x30);
    psVar183 = (secp256k1_ge *)(uVar181 & 0xffffffffffff);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar182;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar182;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar187;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = a_04;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar188 * 2;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar189;
    auVar2 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
    uVar181 = auVar2._0_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | (ulong)psStack_f8;
    auVar2 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
    uVar181 = auVar2._0_8_;
    auStack_e0._0_8_ = uVar181 & 0xfffffffffffff;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar182 * 2;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar187;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar188;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = a_04;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar189;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar189;
    auVar3 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
    uVar181 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
    uVar179 = auVar2._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar181 >> 0x34 | auVar3._8_8_ << 0xc;
    auStack_e0._8_8_ = uVar179 & 0xfffffffffffff;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar179 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar182 * 2;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar188;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar187;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar187;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar189;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = a_04;
    auVar151 = auVar19 * auVar97 + auVar151;
    uVar182 = auVar151._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    auStack_e0._16_8_ = uVar187 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = (uVar187 >> 0x34 | auVar2._8_8_ << 0xc) + uStack_68;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar182 >> 0x34 | auVar151._8_8_ << 0xc;
    auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
    uVar182 = auVar152._0_8_;
    auStack_e0._24_8_ = uVar182 & 0xfffffffffffff;
    auStack_e0._32_8_ = (long)(psVar183->x).n + (uVar182 >> 0x34 | auVar152._8_8_ << 0xc);
    auStack_e0._40_4_ = 1;
    auStack_e0._44_4_ = 0;
    psStack_108 = (secp256k1_gej *)0x11a132;
    psStack_f0 = in_RSI;
    auStack_e0._64_8_ = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)auStack_e0);
    psStack_108 = (secp256k1_gej *)0x11a13a;
    a_01 = in_RSI;
    secp256k1_fe_verify(&in_RSI->x);
    b = in_RSI;
    if (8 < (in_RSI->x).magnitude) goto LAB_0011ab2a;
    b = (secp256k1_gej *)&stack0xffffffffffffff98;
    uVar182 = (in_RSI->x).n[0];
    uVar187 = (in_RSI->x).n[1];
    uVar188 = (in_RSI->x).n[2];
    uVar189 = (in_RSI->x).n[3];
    uVar181 = (in_RSI->x).n[4];
    unaff_R15 = 0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar182 * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar189;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar187 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar188;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar181;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar181;
    uVar179 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar179 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar180 = auVar2._0_8_;
    auStack_e0._64_8_ = uVar180 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar180 >> 0x34 | auVar2._8_8_ << 0xc;
    a_04 = (secp256k1_gej *)(uVar181 * 2);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar182;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = a_04;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar187 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar189;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar188;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar188;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar179 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar2 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
             auVar29 * ZEXT816(0x1000003d10);
    uVar181 = auVar2._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    psStack_e8 = (secp256k1_ge *)((uVar181 & 0xfffffffffffff) >> 0x30);
    psVar183 = (secp256k1_ge *)(uVar181 & 0xffffffffffff);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar182;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar182;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar187;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = a_04;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar188 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar189;
    auVar2 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar181 = auVar2._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | (ulong)psStack_e8;
    auVar2 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar181 = auVar2._0_8_;
    uStack_68 = uVar181 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar181 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar182 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar187;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar188;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = a_04;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar189;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar189;
    auVar3 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar181 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar181 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar179 = auVar2._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar181 >> 0x34 | auVar3._8_8_ << 0xc;
    uStack_60 = uVar179 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar179 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar182 * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar188;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar187;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar187;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar189;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = a_04;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar182 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    uStack_58 = uVar187 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ =
         (long)(((secp256k1_ge *)auStack_e0._64_8_)->x).n + (uVar187 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar182 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar182 = auVar159._0_8_;
    uStack_50 = uVar182 & 0xfffffffffffff;
    uStack_48 = (long)(psVar183->x).n + (uVar182 >> 0x34 | auVar159._8_8_ << 0xc);
    _iStack_40 = 1;
    psStack_108 = (secp256k1_gej *)0x11a384;
    psStack_f8 = psVar183;
    secp256k1_fe_verify((secp256k1_fe *)b);
    psStack_108 = (secp256k1_gej *)0x11a38c;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (10 < iStack_40) goto LAB_0011ab2f;
    uStack_68 = uStack_68 * 3;
    uStack_60 = uStack_60 * 3;
    uStack_58 = uStack_58 * 3;
    uStack_50 = uStack_50 * 3;
    uStack_48 = uStack_48 * 3;
    _iStack_40 = (ulong)(uint)(iStack_40 * 3);
    psStack_108 = (secp256k1_gej *)0x11a3ef;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff98);
    psStack_108 = (secp256k1_gej *)0x11a3f7;
    secp256k1_fe_half((secp256k1_fe *)&stack0xffffffffffffff98);
    b = (secp256k1_gej *)auStack_e0;
    psStack_108 = (secp256k1_gej *)0x11a404;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (1 < (int)auStack_e0._40_4_) goto LAB_0011ab34;
    auStack_e0._64_8_ = 0x3ffffbfffff0bc - auStack_e0._0_8_;
    uStack_98 = 0x3ffffffffffffc - auStack_e0._8_8_;
    psVar183 = (secp256k1_ge *)(auStack_e0 + 0x40);
    uStack_90 = 0x3ffffffffffffc - auStack_e0._16_8_;
    lStack_88 = 0x3ffffffffffffc - auStack_e0._24_8_;
    uStack_80 = 0x3fffffffffffc - auStack_e0._32_8_;
    uStack_78 = 2;
    psStack_108 = (secp256k1_gej *)0x11a45b;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    psStack_108 = (secp256k1_gej *)0x11a46b;
    secp256k1_fe_mul((secp256k1_fe *)psVar183,(secp256k1_fe *)psVar183,&psStack_f0->x);
    b = (secp256k1_gej *)&stack0xffffffffffffff98;
    psStack_108 = (secp256k1_gej *)0x11a47b;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (8 < iStack_40) goto LAB_0011ab39;
    unaff_R15 = 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uStack_68 * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_50;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uStack_60 * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_58;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_48;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_48;
    uVar182 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    psStack_f8 = (secp256k1_ge *)(uVar187 & 0xfffffffffffff);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar187 >> 0x34 | auVar2._8_8_ << 0xc;
    a_04 = (secp256k1_gej *)(uStack_48 * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uStack_68;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = a_04;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_60 * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_50;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_58;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uStack_58;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar182 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar2 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar182 = auVar2._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_e0._56_8_ = (uVar182 & 0xfffffffffffff) >> 0x30;
    psVar183 = (secp256k1_ge *)(uVar182 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uStack_68;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uStack_68;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_60;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = a_04;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_58 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uStack_50;
    auVar2 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar182 = auVar2._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar182 & 0xfffffffffffff) << 4 | auStack_e0._56_8_;
    auVar2 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar182 = auVar2._0_8_;
    (psVar185->x).n[0] = uVar182 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uStack_68 * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uStack_60;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_58;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = a_04;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_50;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_50;
    auVar3 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar182 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar182 >> 0x34 | auVar3._8_8_ << 0xc;
    (psVar185->x).n[1] = uVar187 & 0xfffffffffffff;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar187 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uStack_68 * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_58;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_60;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_60;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_50;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = a_04;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar182 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    (psVar185->x).n[2] = uVar187 & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (long)(psStack_f8->x).n + (uVar187 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar182 >> 0x34 | auVar165._8_8_ << 0xc;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar182 = auVar166._0_8_;
    (psVar185->x).n[3] = uVar182 & 0xfffffffffffff;
    (psVar185->x).n[4] = (long)(psVar183->x).n + (uVar182 >> 0x34 | auVar166._8_8_ << 0xc);
    (psVar185->x).magnitude = 1;
    (psVar185->x).normalized = 0;
    psStack_108 = (secp256k1_gej *)0x11a6bd;
    psStack_e8 = psVar183;
    secp256k1_fe_verify(&psVar185->x);
    psStack_108 = (secp256k1_gej *)0x11a6c5;
    secp256k1_fe_verify(&psVar185->x);
    b = (secp256k1_gej *)(auStack_e0 + 0x40);
    psStack_108 = (secp256k1_gej *)0x11a6d2;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    iVar177 = (int)uStack_78 + (psVar185->x).magnitude;
    if (0x20 < iVar177) goto LAB_0011ab3e;
    uVar174 = (psVar185->x).n[1];
    uVar175 = (psVar185->x).n[2];
    uVar176 = (psVar185->x).n[3];
    b = (secp256k1_gej *)(auStack_e0 + 0x40);
    (psVar185->x).n[0] = (long)((secp256k1_fe *)auStack_e0._64_8_)->n + (psVar185->x).n[0];
    (psVar185->x).n[1] = uVar174 + uStack_98;
    (psVar185->x).n[2] = uVar175 + uStack_90;
    (psVar185->x).n[3] = uVar176 + lStack_88;
    puVar1 = (psVar185->x).n + 4;
    *puVar1 = *puVar1 + uStack_80;
    (psVar185->x).magnitude = iVar177;
    (psVar185->x).normalized = 0;
    psStack_108 = (secp256k1_gej *)0x11a71d;
    secp256k1_fe_verify(&psVar185->x);
    psStack_108 = (secp256k1_gej *)0x11a725;
    secp256k1_fe_verify(&psVar185->x);
    psStack_108 = (secp256k1_gej *)0x11a72d;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    iVar177 = (int)uStack_78 + (psVar185->x).magnitude;
    if (0x20 < iVar177) goto LAB_0011ab43;
    uVar174 = (psVar185->x).n[1];
    uVar175 = (psVar185->x).n[2];
    uVar176 = (psVar185->x).n[3];
    (psVar185->x).n[0] = (long)((secp256k1_fe *)auStack_e0._64_8_)->n + (psVar185->x).n[0];
    (psVar185->x).n[1] = uVar174 + uStack_98;
    (psVar185->x).n[2] = uVar175 + uStack_90;
    (psVar185->x).n[3] = uVar176 + lStack_88;
    puVar1 = (psVar185->x).n + 4;
    *puVar1 = *puVar1 + uStack_80;
    (psVar185->x).magnitude = iVar177;
    (psVar185->x).normalized = 0;
    psStack_108 = (secp256k1_gej *)0x11a77a;
    secp256k1_fe_verify(&psVar185->x);
    b = (secp256k1_gej *)auStack_e0;
    psStack_108 = (secp256k1_gej *)0x11a787;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if (8 < (int)auStack_e0._40_4_) goto LAB_0011ab48;
    unaff_R15 = 0xfffffffffffff;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_e0._0_8_ * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_e0._24_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_e0._8_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_e0._16_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_e0._32_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_e0._32_8_;
    uVar182 = SUB168(auVar64 * auVar132,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
    uVar187 = auVar2._0_8_;
    psStack_f8 = (secp256k1_ge *)(uVar187 & 0xfffffffffffff);
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar187 >> 0x34 | auVar2._8_8_ << 0xc;
    a_04 = (secp256k1_gej *)(auStack_e0._32_8_ * 2);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_e0._0_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = a_04;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_e0._8_8_ * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_e0._24_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_e0._16_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_e0._16_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar182 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
    auVar2 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
             auVar69 * ZEXT816(0x1000003d10);
    uVar182 = auVar2._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_e0._56_8_ = (uVar182 & 0xfffffffffffff) >> 0x30;
    psVar183 = (secp256k1_ge *)(uVar182 & 0xffffffffffff);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_e0._0_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_e0._0_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_e0._8_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = a_04;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_e0._16_8_ * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_e0._24_8_;
    auVar2 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
    uVar182 = auVar2._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar182 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (uVar182 & 0xfffffffffffff) << 4 | auStack_e0._56_8_;
    auVar2 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
    uVar187 = auVar2._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar187 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_e0._0_8_ * 2;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auStack_e0._8_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_e0._16_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = a_04;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_e0._24_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auStack_e0._24_8_;
    auVar3 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
    uVar182 = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
    uVar188 = auVar2._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar182 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar188 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_e0._0_8_ * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_e0._16_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_e0._8_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_e0._8_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_e0._24_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = a_04;
    auVar172 = auVar79 * auVar145 + auVar172;
    uVar182 = auVar172._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar182 & 0xfffffffffffff;
    auVar2 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
    uVar189 = auVar2._0_8_;
    auStack_e0._16_8_ = uVar189 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (long)(psStack_f8->x).n + (uVar189 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar182 >> 0x34 | auVar172._8_8_ << 0xc;
    auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
    uVar182 = auVar173._0_8_;
    auStack_e0._24_8_ = uVar182 & 0xfffffffffffff;
    auStack_e0._32_8_ = (long)(psVar183->x).n + (uVar182 >> 0x34 | auVar173._8_8_ << 0xc);
    auStack_e0._40_4_ = 1;
    auStack_e0._44_4_ = 0;
    psStack_108 = (secp256k1_gej *)0x11a9cf;
    psStack_e8 = psVar183;
    auStack_e0._0_8_ = uVar187 & 0xfffffffffffff;
    auStack_e0._8_8_ = uVar188 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)auStack_e0);
    b = (secp256k1_gej *)(auStack_e0 + 0x40);
    psStack_108 = (secp256k1_gej *)0x11a9dc;
    secp256k1_fe_verify((secp256k1_fe *)b);
    psStack_108 = (secp256k1_gej *)0x11a9e4;
    a_01 = psVar185;
    secp256k1_fe_verify(&psVar185->x);
    uVar178 = (psVar185->x).magnitude + (int)uStack_78;
    if (0x20 < (int)uVar178) goto LAB_0011ab4d;
    psVar183 = (secp256k1_ge *)(auStack_e0 + 0x40);
    auStack_e0._64_8_ = (long)((secp256k1_fe *)auStack_e0._64_8_)->n + (psVar185->x).n[0];
    uStack_98 = (psVar185->x).n[1] + uStack_98;
    uStack_90 = (psVar185->x).n[2] + uStack_90;
    lStack_88 = (psVar185->x).n[3] + lStack_88;
    uStack_80 = uStack_80 + (psVar185->x).n[4];
    uStack_78 = (ulong)uVar178;
    psStack_108 = (secp256k1_gej *)0x11aa34;
    secp256k1_fe_verify((secp256k1_fe *)psVar183);
    b = (secp256k1_gej *)&psVar185->y;
    psStack_108 = (secp256k1_gej *)0x11aa4b;
    secp256k1_fe_mul((secp256k1_fe *)b,(secp256k1_fe *)psVar183,
                     (secp256k1_fe *)&stack0xffffffffffffff98);
    psStack_108 = (secp256k1_gej *)0x11aa53;
    secp256k1_fe_verify((secp256k1_fe *)b);
    a_04 = (secp256k1_gej *)auStack_e0;
    psStack_108 = (secp256k1_gej *)0x11aa60;
    a_01 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iVar177 = auStack_e0._40_4_ + (psVar185->y).magnitude;
    if (0x20 < iVar177) goto LAB_0011ab52;
    uVar174 = (psVar185->y).n[1];
    uVar175 = (psVar185->y).n[2];
    uVar176 = (psVar185->y).n[3];
    (psVar185->y).n[0] = (psVar185->y).n[0] + auStack_e0._0_8_;
    (psVar185->y).n[1] = uVar174 + auStack_e0._8_8_;
    (psVar185->y).n[2] = uVar175 + auStack_e0._16_8_;
    (psVar185->y).n[3] = uVar176 + auStack_e0._24_8_;
    puVar1 = (psVar185->y).n + 4;
    *puVar1 = *puVar1 + auStack_e0._32_8_;
    (psVar185->y).magnitude = iVar177;
    (psVar185->y).normalized = 0;
    psStack_108 = (secp256k1_gej *)0x11aaab;
    secp256k1_fe_verify((secp256k1_fe *)b);
    psStack_108 = (secp256k1_gej *)0x11aab3;
    a_01 = b;
    secp256k1_fe_verify((secp256k1_fe *)b);
    if ((psVar185->y).magnitude < 3) {
      uVar174 = (psVar185->y).n[1];
      uVar175 = (psVar185->y).n[2];
      uVar176 = (psVar185->y).n[3];
      (psVar185->y).n[0] = 0x5ffff9ffffe91a - (psVar185->y).n[0];
      (psVar185->y).n[1] = 0x5ffffffffffffa - uVar174;
      (psVar185->y).n[2] = 0x5ffffffffffffa - uVar175;
      (psVar185->y).n[3] = 0x5ffffffffffffa - uVar176;
      (psVar185->y).n[4] = 0x5fffffffffffa - (psVar185->y).n[4];
      (psVar185->y).magnitude = 3;
      (psVar185->y).normalized = 0;
      psStack_108 = (secp256k1_gej *)0x11ab0b;
      secp256k1_fe_verify((secp256k1_fe *)b);
      psStack_108 = (secp256k1_gej *)0x11ab13;
      secp256k1_gej_verify(psVar185);
      return;
    }
  }
  else {
    psStack_108 = (secp256k1_gej *)0x11ab2a;
    secp256k1_gej_double_cold_11();
    a_04 = in_RSI;
LAB_0011ab2a:
    psStack_108 = (secp256k1_gej *)0x11ab2f;
    secp256k1_gej_double_cold_10();
LAB_0011ab2f:
    psStack_108 = (secp256k1_gej *)0x11ab34;
    secp256k1_gej_double_cold_9();
LAB_0011ab34:
    psStack_108 = (secp256k1_gej *)0x11ab39;
    secp256k1_gej_double_cold_8();
LAB_0011ab39:
    psStack_108 = (secp256k1_gej *)0x11ab3e;
    secp256k1_gej_double_cold_7();
LAB_0011ab3e:
    psStack_108 = (secp256k1_gej *)0x11ab43;
    secp256k1_gej_double_cold_6();
LAB_0011ab43:
    psStack_108 = (secp256k1_gej *)0x11ab48;
    secp256k1_gej_double_cold_5();
LAB_0011ab48:
    psStack_108 = (secp256k1_gej *)0x11ab4d;
    secp256k1_gej_double_cold_4();
LAB_0011ab4d:
    psStack_108 = (secp256k1_gej *)0x11ab52;
    secp256k1_gej_double_cold_3();
LAB_0011ab52:
    psStack_108 = (secp256k1_gej *)0x11ab57;
    secp256k1_gej_double_cold_2();
  }
  psStack_108 = (secp256k1_gej *)secp256k1_fe_mul_int_unchecked;
  secp256k1_gej_double_cold_1();
  psStack_120 = (secp256k1_gej *)0x11ab69;
  a_00 = psVar183;
  a_02 = a_01;
  psStack_110 = b;
  psStack_108 = psVar185;
  secp256k1_fe_verify(&a_01->x);
  iVar177 = (a_01->x).magnitude * (int)psVar183;
  if (iVar177 < 0x21) {
    uVar182 = (ulong)psVar183 & 0xffffffff;
    (a_01->x).n[0] = (a_01->x).n[0] * uVar182;
    (a_01->x).n[1] = (a_01->x).n[1] * uVar182;
    (a_01->x).n[2] = (a_01->x).n[2] * uVar182;
    (a_01->x).n[3] = (a_01->x).n[3] * uVar182;
    (a_01->x).n[4] = uVar182 * (a_01->x).n[4];
    (a_01->x).magnitude = iVar177;
    (a_01->x).normalized = 0;
    secp256k1_fe_verify(&a_01->x);
    return;
  }
  psStack_120 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  psStack_128 = (secp256k1_gej *)0x11abd3;
  psVar185 = a_02;
  psStack_120 = a_01;
  secp256k1_fe_verify(&a_02->x);
  iVar177 = (a_02->x).magnitude;
  if (iVar177 < 0x20) {
    psVar185 = (secp256k1_gej *)(a_02->x).n[0];
    uVar182 = -(ulong)((uint)psVar185 & 1);
    uVar187 = uVar182 >> 0xc;
    a_00 = (secp256k1_ge *)((long)(psVar185->x).n + (uVar187 & 0xffffefffffc2f));
    if (((ulong)a_00 & 1) == 0) {
      uVar188 = (uVar182 >> 0x10) + (a_02->x).n[4];
      uVar189 = uVar187 + (a_02->x).n[3];
      uVar178 = (uint)(uVar182 >> 0x2c);
      auVar190._0_8_ = CONCAT44(uVar178,(int)uVar187);
      auVar190._8_4_ = (int)uVar187;
      auVar190._12_4_ = uVar178;
      uVar182 = auVar190._0_8_ + (a_02->x).n[1];
      uVar187 = auVar190._8_8_ + (a_02->x).n[2];
      (a_02->x).n[0] = ((ulong)((uint)uVar182 & 1) << 0x33) + ((ulong)a_00 >> 1);
      (a_02->x).n[1] = ((uVar187 & 1) << 0x33) + (uVar182 >> 1);
      (a_02->x).n[2] = ((uVar189 & 1) << 0x33) + (uVar187 >> 1);
      (a_02->x).n[3] = ((ulong)((uint)uVar188 & 1) << 0x33) + (uVar189 >> 1);
      (a_02->x).n[4] = uVar188 >> 1;
      (a_02->x).magnitude = (iVar177 >> 1) + 1;
      (a_02->x).normalized = 0;
      secp256k1_fe_verify(&a_02->x);
      return;
    }
  }
  else {
    psStack_128 = (secp256k1_gej *)0x11ac9e;
    secp256k1_fe_half_cold_2();
  }
  psStack_128 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_half_cold_1();
  pcStack_140 = (code *)0x11acb2;
  psVar183 = a_00;
  psStack_130 = a_02;
  psStack_128 = a_04;
  secp256k1_fe_verify(&psVar185->x);
  pcStack_140 = (code *)0x11acba;
  psVar186 = a_00;
  secp256k1_fe_verify(&a_00->x);
  iVar177 = (a_00->x).magnitude + (psVar185->x).magnitude;
  if (iVar177 < 0x21) {
    (psVar185->x).n[0] = (psVar185->x).n[0] + (a_00->x).n[0];
    puVar1 = (psVar185->x).n + 1;
    *puVar1 = *puVar1 + (a_00->x).n[1];
    puVar1 = (psVar185->x).n + 2;
    *puVar1 = *puVar1 + (a_00->x).n[2];
    puVar1 = (psVar185->x).n + 3;
    *puVar1 = *puVar1 + (a_00->x).n[3];
    puVar1 = (psVar185->x).n + 4;
    *puVar1 = *puVar1 + (a_00->x).n[4];
    (psVar185->x).magnitude = iVar177;
    (psVar185->x).normalized = 0;
    secp256k1_fe_verify(&psVar185->x);
    return;
  }
  pcStack_140 = secp256k1_ge_to_storage;
  secp256k1_fe_add_cold_1();
  a_03 = (secp256k1_ge *)auStack_1b0;
  psVar184 = psVar183;
  r = psVar183;
  psStack_150 = psVar185;
  psStack_148 = a_00;
  pcStack_140 = (code *)unaff_R15;
  secp256k1_ge_verify(psVar183);
  if (psVar183->infinity == 0) {
    auStack_1b0._48_8_ = (psVar183->x).n[0];
    uStack_178 = (psVar183->x).n[1];
    uStack_170 = (psVar183->x).n[2];
    uStack_168 = (psVar183->x).n[3];
    uStack_160 = (psVar183->x).n[4];
    uStack_158._0_4_ = (psVar183->x).magnitude;
    iStack_154 = (psVar183->x).normalized;
    r = (secp256k1_ge *)(auStack_1b0 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r);
    auStack_1b0._0_8_ = (psVar183->y).n[0];
    auStack_1b0._8_8_ = (psVar183->y).n[1];
    auStack_1b0._16_8_ = (psVar183->y).n[2];
    auStack_1b0._24_8_ = (psVar183->y).n[3];
    auStack_1b0._32_8_ = (psVar183->y).n[4];
    auStack_1b0._40_4_ = (psVar183->y).magnitude;
    auStack_1b0._44_4_ = (psVar183->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_1b0);
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (iStack_154 != 0) {
      (psVar186->x).n[0] = uStack_178 << 0x34 | auStack_1b0._48_8_;
      (psVar186->x).n[1] = uStack_170 << 0x28 | uStack_178 >> 0xc;
      (psVar186->x).n[2] = uStack_168 << 0x1c | uStack_170 >> 0x18;
      (psVar186->x).n[3] = uStack_160 << 0x10 | uStack_168 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1b0);
      if (auStack_1b0._44_4_ != 0) {
        (psVar186->x).n[4] = auStack_1b0._8_8_ << 0x34 | auStack_1b0._0_8_;
        uVar182 = auStack_1b0._16_8_ << 0x28 | (ulong)auStack_1b0._8_8_ >> 0xc;
        (psVar186->x).magnitude = (int)uVar182;
        (psVar186->x).normalized = (int)(uVar182 >> 0x20);
        (psVar186->y).n[0] = auStack_1b0._24_8_ << 0x1c | (ulong)auStack_1b0._16_8_ >> 0x18;
        (psVar186->y).n[1] = auStack_1b0._32_8_ << 0x10 | (ulong)auStack_1b0._24_8_ >> 0x24;
        return;
      }
      goto LAB_0011ae5c;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_03 = r;
  secp256k1_ge_to_storage_cold_3();
LAB_0011ae5c:
  secp256k1_ge_to_storage_cold_2();
  (a_03->x).n[0] = (psVar184->x).n[0] & 0xfffffffffffff;
  (a_03->x).n[1] = ((psVar184->x).n[1] & 0xffffffffff) << 0xc | (psVar184->x).n[0] >> 0x34;
  (a_03->x).n[2] = ((psVar184->x).n[2] & 0xfffffff) << 0x18 | (psVar184->x).n[1] >> 0x28;
  (a_03->x).n[3] = ((psVar184->x).n[3] & 0xffff) << 0x24 | (psVar184->x).n[2] >> 0x1c;
  (a_03->x).n[4] = (psVar184->x).n[3] >> 0x10;
  (a_03->x).magnitude = 1;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  (a_03->y).n[0] = (psVar184->x).n[4] & 0xfffffffffffff;
  uVar182._0_4_ = (psVar184->x).magnitude;
  uVar182._4_4_ = (psVar184->x).normalized;
  (a_03->y).n[1] = (uVar182 & 0xffffffffff) << 0xc | (psVar184->x).n[4] >> 0x34;
  uVar187._0_4_ = (psVar184->x).magnitude;
  uVar187._4_4_ = (psVar184->x).normalized;
  (a_03->y).n[2] = ((psVar184->y).n[0] & 0xfffffff) << 0x18 | uVar187 >> 0x28;
  (a_03->y).n[3] = ((psVar184->y).n[1] & 0xffff) << 0x24 | (psVar184->y).n[0] >> 0x1c;
  (a_03->y).n[4] = (psVar184->y).n[1] >> 0x10;
  (a_03->y).magnitude = 1;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  a_03->infinity = 0;
  secp256k1_ge_verify(a_03);
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
#ifdef VERIFY
    secp256k1_fe_verify(&a->x);
    secp256k1_fe_verify(&a->y);
    secp256k1_fe_verify(&a->z);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
#endif
    (void)a;
}